

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

NamedPoint * helics::helicsGetNamedPoint(string_view val)

{
  double dVar1;
  value_t vVar2;
  int iVar3;
  json *element;
  NamedPoint *in_RDI;
  json json;
  NamedPoint *namePoint;
  string *in_stack_fffffffffffffef8;
  NamedPoint *in_stack_ffffffffffffff00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  string *in_stack_ffffffffffffff18;
  NamedPoint *__a;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  allocator<char> local_99 [9];
  string_view in_stack_ffffffffffffff70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_30;
  undefined1 local_19;
  
  local_19 = 0;
  __a = in_RDI;
  NamedPoint::NamedPoint(in_stack_ffffffffffffff00);
  fileops::loadJsonStr_abi_cxx11_(in_stack_ffffffffffffff70);
  vVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::type(&local_30);
  element = (json *)(ulong)(byte)(vVar2 - object);
  switch(element) {
  case (json *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(allocator<char> *)__a);
    fileops::replaceIfMember
              ((json *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(double *)0x32ab50);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff00->name);
    std::allocator<char>::~allocator(local_99);
    in_stack_ffffffffffffff00 = (NamedPoint *)&stack0xffffffffffffff3f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(allocator<char> *)__a);
    fileops::replaceIfMember
              (element,in_stack_ffffffffffffff18,
               (string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::__cxx11::string::~string(&in_stack_ffffffffffffff00->name);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
    break;
  case (json *)0x1:
    break;
  case (json *)0x2:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_ffffffffffffff08);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(&in_stack_ffffffffffffff00->name);
    break;
  default:
    break;
  case (json *)0x4:
  case (json *)0x5:
    iVar3 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<int,int>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)in_stack_ffffffffffffff00);
    in_RDI->value = (double)iVar3;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_stack_ffffffffffffff00->name,(char *)in_stack_fffffffffffffef8);
    break;
  case (json *)0x6:
    dVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::get<double,double>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_ffffffffffffff00);
    in_RDI->value = dVar1;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_stack_ffffffffffffff00->name,(char *)in_stack_fffffffffffffef8);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_ffffffffffffff00);
  return __a;
}

Assistant:

NamedPoint helicsGetNamedPoint(std::string_view val)
{
    NamedPoint namePoint;
    try {
        auto json = fileops::loadJsonStr(val);
        switch (json.type()) {
            case nlohmann::json::value_t::number_float:
                namePoint.value = json.get<double>();
                namePoint.name = "value";
                break;
            case nlohmann::json::value_t::string:
                namePoint.name = json.get<std::string>();
                break;
            case nlohmann::json::value_t::array:
                break;
            case nlohmann::json::value_t::number_integer:
            case nlohmann::json::value_t::number_unsigned:
                namePoint.value = static_cast<double>(json.get<int>());
                namePoint.name = "value";
                break;
            case nlohmann::json::value_t::object:
                fileops::replaceIfMember(json, "value", namePoint.value);
                fileops::replaceIfMember(json, "name", namePoint.name);
                break;
            default:
                break;
        }
    }
    catch (...) {
        namePoint.name = val;
    }
    return namePoint;
}